

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O1

exr_result_t save_chromaticities(_internal_exr_context *ctxt,exr_attribute_t *a)

{
  exr_attr_chromaticities_t *peVar1;
  exr_result_t eVar2;
  int32_t isz;
  exr_attr_chromaticities_t tmp;
  undefined4 local_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  peVar1 = (a->field_6).chromaticities;
  local_38 = peVar1->red_x;
  fStack_34 = peVar1->red_y;
  fStack_30 = peVar1->green_x;
  fStack_2c = peVar1->green_y;
  local_28 = peVar1->blue_x;
  fStack_24 = peVar1->blue_y;
  fStack_20 = peVar1->white_x;
  fStack_1c = peVar1->white_y;
  local_3c = 0x20;
  eVar2 = (*ctxt->do_write)(ctxt,&local_3c,4,&ctxt->output_file_offset);
  if (eVar2 == 0) {
    eVar2 = (*ctxt->do_write)(ctxt,&local_38,0x20,&ctxt->output_file_offset);
  }
  return eVar2;
}

Assistant:

static exr_result_t
save_chromaticities (
    struct _internal_exr_context* ctxt, const exr_attribute_t* a)
{
    exr_result_t              rv;
    exr_attr_chromaticities_t tmp = *(a->chromaticities);

    rv = save_attr_sz (ctxt, sizeof (exr_attr_chromaticities_t));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 8);
    return rv;
}